

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Style ON_Font::FontStyleFromUnsigned(uint unsigned_font_style)

{
  Style local_9;
  uint unsigned_font_style_local;
  
  if (unsigned_font_style == 1) {
    local_9 = Upright;
  }
  else if (unsigned_font_style == 2) {
    local_9 = Italic;
  }
  else if (unsigned_font_style == 3) {
    local_9 = Oblique;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x1a60,"","unsigned_font_style is not valid");
    local_9 = Upright;
  }
  return local_9;
}

Assistant:

ON_Font::Style ON_Font::FontStyleFromUnsigned(
  unsigned int unsigned_font_style
  )
{
  switch (unsigned_font_style)
  {
  ON_ENUM_FROM_UNSIGNED_CASE( ON_Font::Style::Upright);
  ON_ENUM_FROM_UNSIGNED_CASE( ON_Font::Style::Italic);
  ON_ENUM_FROM_UNSIGNED_CASE( ON_Font::Style::Oblique);
  default:
    break;
  }
  ON_ERROR("unsigned_font_style is not valid");
  return ON_Font::Style::Upright;
}